

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

void __thiscall FIX::DataDictionary::iterate(DataDictionary *this,FieldMap *map,MsgType *msgType)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RepeatedTag *this_00;
  long lVar4;
  allocator<char> local_71;
  string local_70;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_50;
  reference local_48;
  FieldBase *field;
  FieldBase *local_38;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_30;
  const_iterator i;
  int lastField;
  MsgType *msgType_local;
  FieldMap *map_local;
  DataDictionary *this_local;
  
  i._M_current._4_4_ = 0;
  __gnu_cxx::
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  ::__normal_iterator(&local_30);
  local_38 = (FieldBase *)FieldMap::begin(map);
  local_30._M_current = local_38;
  while( true ) {
    field = (FieldBase *)FieldMap::end(map);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
                        *)&field);
    if (!bVar1) {
      return;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
               ::operator*(&local_30);
    local_50._M_current = (FieldBase *)FieldMap::begin(map);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_50);
    bVar1 = false;
    if (bVar2) {
      iVar3 = FieldBase::getTag(local_48);
      bVar1 = iVar3 == i._M_current._4_4_;
    }
    if (bVar1) break;
    checkHasValue(this,local_48);
    if ((this->m_hasVersion & 1U) != 0) {
      checkValidFormat(this,local_48);
      checkValue(this,local_48);
    }
    StringField::getValue_abi_cxx11_(&(this->m_beginString).super_StringField);
    lVar4 = std::__cxx11::string::length();
    if ((lVar4 != 0) && (bVar1 = shouldCheckTag(this,local_48), bVar1)) {
      checkValidTagNumber(this,local_48);
      bVar1 = Message::isHeaderField(local_48,this);
      if ((!bVar1) && (bVar1 = Message::isTrailerField(local_48,this), !bVar1)) {
        checkIsInMessage(this,local_48,msgType);
        checkGroupCount(this,local_48,map,msgType);
      }
    }
    i._M_current._4_4_ = FieldBase::getTag(local_48);
    __gnu_cxx::
    __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
    ::operator++(&local_30);
  }
  this_00 = (RepeatedTag *)__cxa_allocate_exception(0x58);
  iVar3 = i._M_current._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  RepeatedTag::RepeatedTag(this_00,iVar3,&local_70);
  __cxa_throw(this_00,&RepeatedTag::typeinfo,RepeatedTag::~RepeatedTag);
}

Assistant:

void DataDictionary::iterate(const FieldMap &map, const MsgType &msgType) const {
  int lastField = 0;

  FieldMap::const_iterator i;
  for (i = map.begin(); i != map.end(); ++i) {
    const FieldBase &field = (*i);
    if (i != map.begin() && (field.getTag() == lastField)) {
      throw RepeatedTag(lastField);
    }
    checkHasValue(field);

    if (m_hasVersion) {
      checkValidFormat(field);
      checkValue(field);
    }

    if (m_beginString.getValue().length() && shouldCheckTag(field)) {
      checkValidTagNumber(field);
      if (!Message::isHeaderField(field, this) && !Message::isTrailerField(field, this)) {
        checkIsInMessage(field, msgType);
        checkGroupCount(field, map, msgType);
      }
    }
    lastField = field.getTag();
  }
}